

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int btrimws(bstring b)

{
  ulong uVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  ushort **ppuVar6;
  ushort *puVar7;
  int iVar8;
  ulong uVar9;
  byte *pbVar10;
  
  iVar8 = -1;
  if (((b != (bstring)0x0) && (pbVar10 = b->data, pbVar10 != (byte *)0x0)) &&
     (iVar3 = b->mlen, 0 < iVar3)) {
    uVar4 = b->slen;
    if (((int)uVar4 <= iVar3) && (-1 < (int)uVar4)) {
      uVar9 = (ulong)uVar4 + 1;
      while (uVar1 = uVar9 - 1, 0 < (long)uVar1) {
        ppuVar6 = __ctype_b_loc();
        puVar7 = *ppuVar6;
        lVar5 = uVar9 - 2;
        uVar9 = uVar1;
        if ((*(byte *)((long)puVar7 + (ulong)pbVar10[lVar5] * 2 + 1) & 0x20) == 0) {
          if ((int)uVar1 <= iVar3) {
            pbVar10[uVar1 & 0xffffffff] = 0;
            puVar7 = *ppuVar6;
            pbVar10 = b->data;
          }
          b->slen = (int)uVar1;
          iVar8 = -1;
          do {
            bVar2 = *pbVar10;
            iVar8 = iVar8 + 1;
            pbVar10 = pbVar10 + 1;
          } while ((*(byte *)((long)puVar7 + (ulong)bVar2 * 2 + 1) & 0x20) != 0);
          iVar8 = bdelete(b,0,iVar8);
          return iVar8;
        }
      }
      *pbVar10 = 0;
      b->slen = 0;
      iVar8 = 0;
    }
  }
  return iVar8;
}

Assistant:

int btrimws (bstring b) {
int i, j;

	if (b == NULL || b->data == NULL || b->mlen < b->slen ||
	    b->slen < 0 || b->mlen <= 0) return BSTR_ERR;

	for (i = b->slen - 1; i >= 0; i--) {
		if (!wspace (b->data[i])) {
			if (b->mlen > i) b->data[i+1] = (unsigned char) '\0';
			b->slen = i + 1;
			for (j = 0; wspace (b->data[j]); j++) {}
			return bdelete (b, 0, j);
		}
	}

	b->data[0] = (unsigned char) '\0';
	b->slen = 0;
	return BSTR_OK;
}